

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

string * __thiscall
t_haxe_generator::get_cap_name(string *__return_storage_ptr__,t_haxe_generator *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char cVar6;
  size_type sVar7;
  string inner;
  string local_110;
  string new_inner;
  string inner_types;
  string local_b0;
  string local_90;
  string outer_type;
  string local_50;
  
  if (name->_M_string_length != 0) {
    cVar6 = (char)name;
    lVar3 = std::__cxx11::string::find(cVar6,0x3c);
    lVar4 = std::__cxx11::string::rfind(cVar6,0x3e);
    if (lVar4 != -1 && lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&outer_type,(ulong)name);
      std::__cxx11::string::substr((ulong)&inner_types,(ulong)name);
      std::__cxx11::string::string((string *)&new_inner,"",(allocator *)&inner);
      uVar5 = 0;
      do {
        if (inner_types._M_string_length <= uVar5) {
          std::__cxx11::string::string((string *)&local_b0,(string *)&outer_type);
          get_cap_name(&local_90,this,&local_b0);
          std::operator+(&local_110,&local_90,"<");
          std::operator+(&inner,&local_110,&new_inner);
          std::operator+(__return_storage_ptr__,&inner,">");
          std::__cxx11::string::~string((string *)&inner);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&new_inner);
          std::__cxx11::string::~string((string *)&inner_types);
          std::__cxx11::string::~string((string *)&outer_type);
          return __return_storage_ptr__;
        }
        iVar2 = 0;
        for (; sVar7 = inner_types._M_string_length, inner_types._M_string_length != uVar5;
            uVar5 = uVar5 + 1) {
          cVar6 = inner_types._M_dataplus._M_p[uVar5];
          if (cVar6 == ',') {
            sVar7 = uVar5;
            if (iVar2 == 0) break;
          }
          else if (cVar6 == '<') {
            iVar2 = iVar2 + 1;
          }
          else if (cVar6 == '>') {
            iVar2 = iVar2 + -1;
          }
        }
        if (new_inner._M_string_length != 0) {
          std::__cxx11::string::append((char *)&new_inner);
        }
        std::__cxx11::string::substr((ulong)&inner,(ulong)&inner_types);
        std::__cxx11::string::string((string *)&local_50,(string *)&inner);
        get_cap_name(&local_110,this,&local_50);
        std::__cxx11::string::append((string *)&new_inner);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        uVar5 = sVar7 + 1;
        std::__cxx11::string::~string((string *)&inner);
      } while( true );
    }
    uVar5 = std::__cxx11::string::find_first_not_of((char *)name,0x2e1a71);
    if (uVar5 < name->_M_string_length) {
      do {
        pcVar1 = (name->_M_dataplus)._M_p;
        iVar2 = tolower((int)pcVar1[uVar5]);
        pcVar1[uVar5] = (char)iVar2;
        do {
          lVar3 = std::__cxx11::string::find(cVar6,0x2e);
          if (lVar3 == -1) goto LAB_001db98b;
          uVar5 = lVar3 + 1;
        } while (name->_M_string_length <= uVar5);
      } while( true );
    }
LAB_001db98b:
    lVar3 = std::__cxx11::string::rfind(cVar6,0x2e);
    if (lVar3 == -1) {
      uVar5 = std::__cxx11::string::find_first_not_of((char *)name,0x2e1a71);
    }
    else {
      uVar5 = lVar3 + 1;
    }
    if (uVar5 < name->_M_string_length) {
      pcVar1 = (name->_M_dataplus)._M_p;
      iVar2 = toupper((int)pcVar1[uVar5]);
      pcVar1[uVar5] = (char)iVar2;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  return __return_storage_ptr__;
}

Assistant:

std::string t_haxe_generator::get_cap_name(std::string name) {
  if (name.length() == 0) {
    return name;
  }

  // test.for.Generic< data.Type, or.the.Like> and handle it recursively
  size_t generic_first = name.find('<');
  size_t generic_last = name.rfind('>');
  if ((generic_first != std::string::npos) && (generic_last != std::string::npos)) {
    string outer_type = name.substr(0, generic_first);
    string inner_types = name.substr(generic_first + 1, generic_last - generic_first - 1);

    string new_inner = "";
    size_t comma_start = 0;
    while (comma_start < inner_types.length()) {
      size_t comma_pos = comma_start;
      int nested = 0;

      while (comma_pos < inner_types.length()) {
        bool found = false;
        switch (inner_types[comma_pos]) {
        case '<':
          ++nested;
          break;
        case '>':
          --nested;
          break;
        case ',':
          found = (nested == 0);
          break;
        }
        if (found) {
          break;
        }
        ++comma_pos;
      }

      if (new_inner.length() > 0) {
        new_inner += ",";
      }

      string inner = inner_types.substr(comma_start, comma_pos - comma_start);
      new_inner += get_cap_name(inner);
      comma_start = ++comma_pos;
    }

    return get_cap_name(outer_type) + "<" + new_inner + ">";
  }

  // package name
  size_t index = name.find_first_not_of(" \n\r\t");
  if (index < name.length()) {
    name[index] = tolower(name[index]);
    index = name.find('.');
    while (index != std::string::npos) {
      if (++index < name.length()) {
        name[index] = tolower(name[index]);
      }
      index = name.find('.', index);
    }
  }

  // class name
  index = name.rfind('.');
  if (index != std::string::npos) {
    ++index;
  } else {
    index = name.find_first_not_of(" \n\r\t");
  }

  if (index < name.length()) {
    name[index] = toupper(name[index]);
  }

  return name;
}